

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_timeout.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::handle_hb_timeout(raft_server *this,int32 srv_id)

{
  bool bVar1;
  __int_type_conflict _Var2;
  int32 peer_id;
  srv_role sVar3;
  int iVar4;
  uint uVar5;
  uint64_t uVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *peVar10;
  msg_type in_ESI;
  long in_RDI;
  lock_guard<std::mutex> guard_1;
  ptr<peer> *in_stack_000001e0;
  raft_server *in_stack_000001e8;
  CbReturnCode rc;
  uint64_t last_log_idx;
  Param param;
  int32 cur_cnt;
  ptr<peer> p;
  iterator pit;
  bool succ;
  ptr<srv_config> s_config;
  uint64_t resp_timer_ms;
  ptr<raft_params> params;
  unique_lock<std::recursive_mutex> guard;
  Param *in_stack_fffffffffffffc18;
  undefined1 __i;
  uint in_stack_fffffffffffffc20;
  Type in_stack_fffffffffffffc24;
  peer *in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  timer_helper *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  int32_t my_id;
  raft_server *in_stack_fffffffffffffca0;
  peer *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  ptr<peer> *in_stack_fffffffffffffd60;
  msg_type in_stack_fffffffffffffd6c;
  raft_server *in_stack_fffffffffffffd70;
  string local_270 [24];
  context *in_stack_fffffffffffffda8;
  ptr<srv_config> *in_stack_fffffffffffffdb0;
  peer *in_stack_fffffffffffffdb8;
  string local_218 [32];
  string local_1f8 [36];
  ReturnCode local_1d4;
  long local_1d0;
  Param local_1c8;
  string local_1a0 [32];
  string local_180 [36];
  uint local_15c;
  string local_148 [32];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_128;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_120;
  string local_118 [39];
  undefined1 local_f1;
  string local_d0 [32];
  ulong local_b0;
  string local_98 [32];
  string local_78 [36];
  int local_54;
  string local_50 [56];
  ulong in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
             (mutex_type *)in_stack_fffffffffffffc18);
  check_srv_to_leave_timeout
            ((raft_server *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffc28);
  if ((bVar1) &&
     (bVar1 = timer_helper::timeout
                        ((timer_helper *)
                         CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68)), bVar1)) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    __i = (undefined1)((ulong)in_stack_fffffffffffffc18 >> 0x38);
    if (bVar1) {
      peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x496864);
      iVar4 = (**(code **)(*(long *)peVar10 + 0x38))();
      if (3 < iVar4) {
        peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x49689d);
        uVar6 = timer_helper::get_us(in_stack_fffffffffffffc60);
        msg_if_given_abi_cxx11_
                  ((char *)local_50,"resign by timeout, %lu us elapsed, resign now",uVar6);
        (**(code **)(*(long *)peVar10 + 0x40))
                  (peVar10,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"handle_hb_timeout",0x40,local_50);
        std::__cxx11::string::~string(local_50);
      }
    }
    std::__atomic_base<int>::operator=
              ((__atomic_base<int> *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
    become_follower((raft_server *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
               (bool)__i);
    local_54 = 1;
    goto LAB_00497cf0;
  }
  bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffc28);
  if ((bVar1) &&
     (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x3a0)), bVar1)) {
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x4969fe);
    in_stack_fffffffffffffd6c = peer::get_id((peer *)0x496a06);
    if (in_stack_fffffffffffffd6c == in_ESI) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x496a54);
        iVar4 = (**(code **)(*(long *)peVar10 + 0x38))();
        if (3 < iVar4) {
          peVar10 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x496a8d);
          msg_if_given_abi_cxx11_
                    ((char *)local_78,"retrying snapshot read for server %d",(ulong)in_ESI);
          (**(code **)(*(long *)peVar10 + 0x40))
                    (peVar10,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_hb_timeout",0x4c,local_78);
          std::__cxx11::string::~string(local_78);
        }
      }
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x496b31);
      bVar1 = peer::need_to_reconnect(in_stack_fffffffffffffc28);
      if (bVar1) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar1) {
          peVar10 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x496b83);
          iVar4 = (**(code **)(*(long *)peVar10 + 0x38))();
          if (3 < iVar4) {
            peVar10 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x496bbc);
            msg_if_given_abi_cxx11_
                      ((char *)local_98,"rpc client for %d needs reconnection",(ulong)in_ESI);
            (**(code **)(*(long *)peVar10 + 0x40))
                      (peVar10,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                       ,"handle_hb_timeout",0x4e,local_98);
            std::__cxx11::string::~string(local_98);
          }
        }
        std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                  ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x496c60);
        nuraft::context::get_params
                  ((context *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x496c86);
        uVar6 = peer::get_resp_timer_us((peer *)0x496c8e);
        local_b0 = uVar6 / 1000;
        peVar7 = std::
                 __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x496ccf);
        iVar4 = *(int *)(peVar7 + 8);
        _Var2 = std::__atomic_base::operator_cast_to_int
                          ((__atomic_base<int> *)in_stack_fffffffffffffc28);
        if (uVar6 / 1000 < (ulong)((long)iVar4 * (long)_Var2)) {
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x496e6b);
          peer::get_config((peer *)0x496e73);
          srv_config::serialize
                    ((srv_config *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
          std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
          srv_config::deserialize
                    ((buffer *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
          std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x496ec0);
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x496ed4);
          std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator*
                    ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)
                     CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
          local_f1 = peer::recreate_rpc(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                                        in_stack_fffffffffffffda8);
          if ((bool)local_f1) {
            local_54 = 0;
          }
          else {
            bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
            if (bVar1) {
              peVar10 = std::
                        __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x496f6f);
              iVar4 = (**(code **)(*(long *)peVar10 + 0x38))();
              if (2 < iVar4) {
                peVar10 = std::
                          __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x496fa8);
                msg_if_given_abi_cxx11_((char *)local_118,"reconnection failed, will not retry");
                (**(code **)(*(long *)peVar10 + 0x40))
                          (peVar10,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                           ,"handle_hb_timeout",0x5e,local_118);
                std::__cxx11::string::~string(local_118);
              }
            }
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
            clear_snapshot_sync_ctx
                      ((raft_server *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       in_stack_fffffffffffffca8);
            local_54 = 1;
          }
          std::shared_ptr<nuraft::srv_config>::~shared_ptr
                    ((shared_ptr<nuraft::srv_config> *)0x4970b8);
        }
        else {
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
          if (bVar1) {
            peVar10 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x496d3e);
            iVar4 = (**(code **)(*(long *)peVar10 + 0x38))();
            if (3 < iVar4) {
              peVar10 = std::
                        __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x496d77);
              msg_if_given_abi_cxx11_
                        ((char *)local_d0,"response timeout: %lu ms, will not retry",local_b0);
              (**(code **)(*(long *)peVar10 + 0x40))
                        (peVar10,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                         ,"handle_hb_timeout",0x54,local_d0);
              std::__cxx11::string::~string(local_d0);
            }
          }
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
          clear_snapshot_sync_ctx
                    ((raft_server *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                     in_stack_fffffffffffffca8);
          local_54 = 1;
        }
        std::shared_ptr<nuraft::raft_params>::~shared_ptr
                  ((shared_ptr<nuraft::raft_params> *)0x4970c5);
        if (local_54 != 0) goto LAB_00497cf0;
      }
      sync_log_to_new_srv((raft_server *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                          in_stack_ffffffffffffffe8);
      local_54 = 1;
      goto LAB_00497cf0;
    }
  }
  local_120._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::find((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
               *)in_stack_fffffffffffffc18,(key_type *)0x497136);
  local_128._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
              *)in_stack_fffffffffffffc18);
  bVar1 = std::__detail::operator==(&local_120,&local_128);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x4971bb);
      iVar4 = (**(code **)(*(long *)peVar10 + 0x38))();
      if (1 < iVar4) {
        peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x4971f4);
        msg_if_given_abi_cxx11_
                  ((char *)local_148,"heartbeat handler error: server %d not exist",(ulong)in_ESI);
        (**(code **)(*(long *)peVar10 + 0x40))
                  (peVar10,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"handle_hb_timeout",0x69,local_148);
        std::__cxx11::string::~string(local_148);
      }
    }
    local_54 = 1;
    goto LAB_00497cf0;
  }
  std::__detail::_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
  ::operator->((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *
               )0x4972a1);
  std::shared_ptr<nuraft::peer>::shared_ptr
            ((shared_ptr<nuraft::peer> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
             (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffc18);
  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x4972ca
            );
  bVar1 = peer::is_leave_flag_set((peer *)0x4972d2);
  if (bVar1) {
    peVar9 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4972f8);
    peer::inc_hb_cnt_since_leave(peVar9);
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x49730f);
    local_15c = peer::get_hb_cnt_since_leave((peer *)0x497317);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x49735f);
      iVar4 = (**(code **)(*(long *)peVar10 + 0x38))();
      if (3 < iVar4) {
        peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x497398);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x4973ad);
        uVar5 = peer::get_id((peer *)0x4973b5);
        msg_if_given_abi_cxx11_
                  ((char *)local_180,"peer %d is not responding for %d HBs since leave request",
                   (ulong)uVar5,(ulong)local_15c);
        (**(code **)(*(long *)peVar10 + 0x40))
                  (peVar10,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"handle_hb_timeout",0x76,local_180);
        std::__cxx11::string::~string(local_180);
      }
    }
    uVar5 = local_15c;
    _Var2 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)in_stack_fffffffffffffc28);
    if ((int)uVar5 < _Var2) goto LAB_0049762b;
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x4974c6);
      iVar4 = (**(code **)(*(long *)peVar10 + 0x38))();
      if (1 < iVar4) {
        peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x4974ff);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x497514);
        uVar5 = peer::get_id((peer *)0x49751c);
        msg_if_given_abi_cxx11_((char *)local_1a0,"force remove peer %d",(ulong)uVar5);
        (**(code **)(*(long *)peVar10 + 0x40))
                  (peVar10,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"handle_hb_timeout",0x7a,local_1a0);
        std::__cxx11::string::~string(local_1a0);
      }
    }
    std::shared_ptr<nuraft::peer>::shared_ptr
              ((shared_ptr<nuraft::peer> *)
               CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
               (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffc18);
    handle_join_leave_rpc_err
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,in_stack_fffffffffffffd60);
    std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x4975f3);
    local_54 = 1;
  }
  else {
LAB_0049762b:
    my_id = *(int32_t *)(in_RDI + 0x38);
    _Var2 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)in_stack_fffffffffffffc28);
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x497657);
    peer_id = peer::get_id((peer *)0x49765f);
    cb_func::Param::Param(&local_1c8,my_id,_Var2,peer_id,(void *)0x0);
    peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4976a2);
    local_1d0 = (**(code **)(*(long *)peVar8 + 0x10))();
    local_1d0 = local_1d0 + -1;
    local_1c8.ctx = &local_1d0;
    std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
              ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x4976e9);
    local_1d4 = cb_func::call((cb_func *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc24,
                              in_stack_fffffffffffffc18);
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffc28);
    if (bVar1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar1) {
        peVar10 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x497761);
        iVar4 = (**(code **)(*(long *)peVar10 + 0x38))();
        if (2 < iVar4) {
          peVar10 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x497794);
          msg_if_given_abi_cxx11_
                    ((char *)local_1f8,"Triggered HB timer but server is shutting down");
          (**(code **)(*(long *)peVar10 + 0x40))
                    (peVar10,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"handle_hb_timeout",0x88,local_1f8);
          std::__cxx11::string::~string(local_1f8);
        }
      }
      local_54 = 1;
    }
    else {
      bVar1 = check_leadership_validity
                        ((raft_server *)
                         CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      if (bVar1) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar1) {
          peVar10 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x497885);
          iVar4 = (**(code **)(*(long *)peVar10 + 0x38))();
          if (4 < iVar4) {
            peVar10 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x4978b8);
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x4978ca);
            uVar5 = peer::get_id((peer *)0x4978d2);
            msg_if_given_abi_cxx11_((char *)local_218,"heartbeat timeout for %d",(ulong)uVar5);
            (**(code **)(*(long *)peVar10 + 0x40))
                      (peVar10,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                       ,"handle_hb_timeout",0x8e,local_218);
            std::__cxx11::string::~string(local_218);
          }
        }
        sVar3 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x49796e);
        if (sVar3 == leader) {
          update_target_priority(in_stack_fffffffffffffca0);
          std::shared_ptr<nuraft::peer>::shared_ptr
                    ((shared_ptr<nuraft::peer> *)
                     CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                     (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffc18);
          request_append_entries(in_stack_000001e8,in_stack_000001e0);
          std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x4979c1);
          peVar9 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x4979ce);
          peer::get_lock(peVar9);
          std::lock_guard<std::mutex>::lock_guard
                    ((lock_guard<std::mutex> *)
                     CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                     (mutex_type *)in_stack_fffffffffffffc18);
          peVar9 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x4979fe);
          bVar1 = peer::is_hb_enabled(peVar9);
          if (bVar1) {
            peVar9 = std::
                     __shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x497a26);
            peer::get_hb_task(peVar9);
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x497a42);
            peer::get_current_hb_interval((peer *)0x497a4a);
            schedule_task((raft_server *)
                          CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                          (ptr<delayed_task> *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
          }
          else {
            bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
            if (bVar1) {
              peVar10 = std::
                        __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x497add);
              iVar4 = (**(code **)(*(long *)peVar10 + 0x38))();
              if (4 < iVar4) {
                peVar10 = std::
                          __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x497b10);
                std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x497b22);
                uVar5 = peer::get_id((peer *)0x497b2a);
                msg_if_given_abi_cxx11_
                          (&stack0xfffffffffffffdb0,"heartbeat is disabled for peer %d",(ulong)uVar5
                          );
                (**(code **)(*(long *)peVar10 + 0x40))
                          (peVar10,5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                           ,"handle_hb_timeout",0x98,&stack0xfffffffffffffdb0);
                std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb0);
              }
            }
          }
          std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x497bbe);
        }
        else {
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
          if (bVar1) {
            peVar10 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x497c06);
            in_stack_fffffffffffffc24 = (**(code **)(*(long *)peVar10 + 0x38))();
            if (2 < (int)in_stack_fffffffffffffc24) {
              peVar10 = std::
                        __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x497c39);
              std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x497c4a);
              in_stack_fffffffffffffc20 = peer::get_id((peer *)0x497c52);
              msg_if_given_abi_cxx11_
                        ((char *)local_270,
                         "Receive a heartbeat event for %d while no longer as a leader",
                         (ulong)in_stack_fffffffffffffc20);
              (**(code **)(*(long *)peVar10 + 0x40))
                        (peVar10,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                         ,"handle_hb_timeout",0x9d,local_270);
              std::__cxx11::string::~string(local_270);
            }
          }
        }
        local_54 = 0;
      }
      else {
        local_54 = 1;
      }
    }
  }
  std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x497cf0);
LAB_00497cf0:
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  return;
}

Assistant:

void raft_server::handle_hb_timeout(int32 srv_id) {
    recur_lock(lock_);

    check_srv_to_leave_timeout();

    if (write_paused_ && reelection_timer_.timeout()) {
        p_in("resign by timeout, %" PRIu64 " us elapsed, resign now",
             reelection_timer_.get_us());
        leader_ = -1;
        become_follower();

        // Clear this flag to avoid pre-vote rejection.
        hb_alive_ = false;
        return;
    }

    if ( srv_to_join_snp_retry_required_ &&
         srv_to_join_ &&
         srv_to_join_->get_id() == srv_id ) {
        p_in("retrying snapshot read for server %d", srv_id);
        if (srv_to_join_->need_to_reconnect()) {
            p_in("rpc client for %d needs reconnection", srv_id);

            ptr<raft_params> params = ctx_->get_params();
            uint64_t resp_timer_ms = srv_to_join_->get_resp_timer_us() / 1000;
            if ( resp_timer_ms >= (uint64_t)params->heart_beat_interval_ *
                                  raft_server::raft_limits_.response_limit_ ) {
                p_in("response timeout: %" PRIu64 " ms, will not retry", resp_timer_ms);
                clear_snapshot_sync_ctx(*srv_to_join_);
                return;
            }

            ptr<srv_config> s_config =
                srv_config::deserialize( *srv_to_join_->get_config().serialize() );
            bool succ = srv_to_join_->recreate_rpc(s_config, *ctx_);
            if (!succ) {
                // Reconnection failed.
                p_wn("reconnection failed, will not retry");
                clear_snapshot_sync_ctx(*srv_to_join_);
                return;
            }
        }
        sync_log_to_new_srv(0);
        return;
    }

    auto pit = peers_.find(srv_id);
    if (pit == peers_.end()) {
        p_er("heartbeat handler error: server %d not exist", srv_id);
        return;
    }

    // To avoid freeing this pointer in the middle of this function.
    ptr<peer> p = pit->second;

    if (p->is_leave_flag_set()) {
        // Leave request has been sent but not removed yet,
        // increase the counter.
        p->inc_hb_cnt_since_leave();
        int32 cur_cnt = p->get_hb_cnt_since_leave();
        p_in("peer %d is not responding for %d HBs since leave request",
             p->get_id(), cur_cnt);

        if (cur_cnt >= raft_server::raft_limits_.leave_limit_) {
            // Force remove the server.
            p_er("force remove peer %d", p->get_id());
            handle_join_leave_rpc_err(msg_type::leave_cluster_request, p);
            return;
        }
    }

    cb_func::Param param(id_, leader_, p->get_id());
    uint64_t last_log_idx = log_store_->next_slot() - 1;
    param.ctx = &last_log_idx;
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::HeartBeat, &param);
    (void)rc;

    // Server is being shut down.
    if (stopping_) {
        p_wn("Triggered HB timer but server is shutting down");
        return;
    }

    if (!check_leadership_validity()) return;

    p_db("heartbeat timeout for %d", p->get_id());
    if (role_ == srv_role::leader) {
        update_target_priority();
        request_append_entries(p);
        {
            std::lock_guard<std::mutex> guard(p->get_lock());
            if (p->is_hb_enabled()) {
                // Schedule another heartbeat if heartbeat is still enabled
                schedule_task(p->get_hb_task(), p->get_current_hb_interval());
            } else {
                p_db("heartbeat is disabled for peer %d", p->get_id());
            }
        }
    } else {
        p_wn("Receive a heartbeat event for %d "
             "while no longer as a leader", p->get_id());
    }
}